

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Module.cpp
# Opt level: O0

bool __thiscall soul::Module::Functions::contains(Functions *this,Function *f)

{
  bool bVar1;
  Function *f_local;
  Functions *this_local;
  
  bVar1 = contains<soul::ArrayWithPreallocation<soul::pool_ref<soul::heart::Function>,32ul>,soul::heart::Function_const&>
                    (&this->functions,f);
  return bVar1;
}

Assistant:

bool Module::Functions::contains (const heart::Function& f) const           { return soul::contains (functions, f); }